

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O1

ssize_t kiste::write(int __fd,void *__buf,size_t __n)

{
  line_t *plVar1;
  pointer extraout_RAX;
  pointer pcVar2;
  line_t *line;
  line_t *line_00;
  undefined4 in_register_0000003c;
  size_t line_no;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> lineTemplate;
  class_t class_data;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> classTemplate;
  cpp serializer;
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> kissTemplate;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> local_c0;
  undefined1 local_a8 [32];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> local_68;
  _serializer_t local_50;
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> local_48;
  
  local_c0.data = (_data_t *)CONCAT44(in_register_0000003c,__fd);
  local_50._os = (local_c0.data)->_os;
  local_c0._serialize = &local_50;
  local_48.child = (terminal_t *)&terminal;
  local_68.child = (terminal_t *)&terminal;
  local_c0.child = (terminal_t *)&terminal;
  local_a8._0_8_ = local_a8 + 0x10;
  local_a8._8_8_ = 0;
  local_a8[0x10] = '\0';
  local_88._M_p = (pointer)&local_78;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68.data = local_c0.data;
  local_68._serialize = local_c0._serialize;
  local_48.data = local_c0.data;
  local_48._serialize = local_c0._serialize;
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_header(&local_48);
  line_00 = *__buf;
  plVar1 = *(line_t **)((long)__buf + 8);
  if (line_00 != plVar1) {
    line_no = 1;
    do {
      switch((line_00->super_line_data_t)._type) {
      case none:
        std::__ostream_insert<char,std::char_traits<char>>((local_c0._serialize)->_os,"\n",1);
        break;
      case cpp:
        LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
        render_cpp<kiste::line_t>(&local_c0,line_00);
        break;
      case text:
        LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
        render_text<kiste::line_t>(&local_c0,line_00);
        break;
      case class_begin:
        std::__cxx11::string::_M_assign((string *)local_a8);
        std::__cxx11::string::_M_assign((string *)&local_88);
        ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
        render_header<kiste::class_t>(&local_68,line_no,(class_t *)local_a8);
        break;
      case class_end:
        ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
        render_footer<kiste::class_t>(&local_68,line_no,(class_t *)local_a8);
        break;
      case member:
        ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp>::
        render_member<kiste::class_t,kiste::member_t>
                  ((ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp> *)&local_68,
                   line_no,(class_t *)local_a8,&(line_00->super_line_data_t)._member);
      }
      line_00 = line_00 + 1;
      line_no = line_no + 1;
    } while (line_00 != plVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((local_48._serialize)->_os,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  pcVar2 = local_a8 + 0x10;
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    pcVar2 = extraout_RAX;
  }
  return (ssize_t)pcVar2;
}

Assistant:

auto write(const parse_context& ctx, const std::vector<line_t>& lines) -> void
  {
    auto serializer = ::kiste::cpp(ctx._os);
    auto kissTemplate = ::kiste::KisteTemplate(ctx, serializer);
    auto classTemplate = ::kiste::ClassTemplate(ctx, serializer);
    auto lineTemplate = ::kiste::LineTemplate(ctx, serializer);

    auto class_data = class_t{};

    kissTemplate.render_header();
    auto line_no = std::size_t{0};
    for (const auto& line : lines)
    {
      ++line_no;
      switch (line._type)
      {
      case line_type::none:
        lineTemplate.render_none();
        break;
      case line_type::cpp:
        lineTemplate.render_cpp(line);
        break;
      case line_type::text:
        lineTemplate.render_text(line);
        break;
      case line_type::class_begin:
        class_data = line._class_data;
        classTemplate.render_header(line_no, class_data);
        break;
      case line_type::member:
        classTemplate.render_member(line_no, class_data, line._member);
        break;
      case line_type::class_end:
        classTemplate.render_footer(line_no, class_data);
        break;
      }
    }
    kissTemplate.render_footer();
  }